

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cursor-read.c
# Opt level: O3

int coda_cursor_read_uint8_array
              (coda_cursor *cursor,uint8_t *dst,coda_array_ordering array_ordering)

{
  int iVar1;
  coda_native_type native_type;
  char *pcVar2;
  coda_type *base_type;
  coda_type *pcVar3;
  undefined8 uVar4;
  char *message;
  long in_FS_OFFSET;
  
  if (((cursor == (coda_cursor *)0x0) || (cursor->n < 1)) ||
     (pcVar3 = (coda_type *)cursor->stack[cursor->n - 1].type, pcVar3 == (coda_type *)0x0)) {
    pcVar2 = "invalid cursor argument (%s:%u)";
    uVar4 = 0xb97;
  }
  else {
    if (dst != (uint8_t *)0x0) {
      if (99 < pcVar3->format) {
        pcVar3 = *(coda_type **)&pcVar3->type_class;
      }
      if (pcVar3->type_class == coda_array_class) {
        pcVar3 = *(coda_type **)(pcVar3 + 1);
        if ((((pcVar3->type_class != coda_integer_class) && (pcVar3->type_class != coda_real_class))
            || ((*(int *)(in_FS_OFFSET + -0x1204) == 0 ||
                (native_type = coda_native_type_double, pcVar3[1].name == (char *)0x0)))) &&
           (native_type = pcVar3->read_type, native_type == coda_native_type_uint8)) {
          iVar1 = read_uint8_array(cursor,dst,array_ordering);
          return -(uint)(iVar1 != 0);
        }
        pcVar2 = coda_type_get_native_type_name(native_type);
        message = "can not read %s data using a uint8 data type";
      }
      else {
        pcVar2 = coda_type_get_class_name(pcVar3->type_class);
        message = "cursor does not refer to an array (current type is %s)";
      }
      coda_set_error(-0x69,message,pcVar2);
      return -1;
    }
    pcVar2 = "dst argument is NULL (%s:%u)";
    uVar4 = 0xb9c;
  }
  coda_set_error(-100,pcVar2,
                 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor-read.c"
                 ,uVar4);
  return -1;
}

Assistant:

LIBCODA_API int coda_cursor_read_uint8_array(const coda_cursor *cursor, uint8_t *dst,
                                             coda_array_ordering array_ordering)
{
    coda_native_type read_type;
    coda_type *type;

    if (cursor == NULL || cursor->n <= 0 || cursor->stack[cursor->n - 1].type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "invalid cursor argument (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (dst == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "dst argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    type = coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type);
    if (type->type_class != coda_array_class)
    {
        coda_set_error(CODA_ERROR_INVALID_TYPE, "cursor does not refer to an array (current type is %s)",
                       coda_type_get_class_name(type->type_class));
        return -1;
    }

    if (get_array_element_read_type(type, &read_type) != 0)
    {
        return -1;
    }
    switch (read_type)
    {
        case coda_native_type_uint8:
            if (read_uint8_array(cursor, dst, array_ordering) != 0)
            {
                return -1;
            }
            break;
        default:
            coda_set_error(CODA_ERROR_INVALID_TYPE, "can not read %s data using a uint8 data type",
                           coda_type_get_native_type_name(read_type));
            return -1;
    }

    return 0;
}